

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O1

string_t __thiscall
duckdb::IntToVarInt<unsigned_long>(duckdb *this,Vector *result,unsigned_long int_value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Vector *pVVar9;
  ulong uVar10;
  idx_t extraout_RDX;
  long lVar11;
  uint uVar12;
  char *blob_00;
  double dVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar38;
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  int iVar40;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar65;
  undefined1 auVar64 [16];
  int iVar66;
  long lVar67;
  long lVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long lVar76;
  long lVar77;
  string_t blob;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  long lStack_30;
  
  pVVar9 = result;
  if (result != (Vector *)0xffffffffffffffff) {
    uVar12 = 1;
    if (result == (Vector *)0x0) goto LAB_008f707c;
    pVVar9 = (Vector *)&result->field_0x1;
  }
  auVar34._8_4_ = (int)((ulong)pVVar9 >> 0x20);
  auVar34._0_8_ = pVVar9;
  auVar34._12_4_ = 0x45300000;
  dVar13 = log2((auVar34._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)pVVar9) - 4503599627370496.0));
  dVar13 = ceil(dVar13 * 0.125);
  uVar12 = (uint)(long)dVar13;
  int_value = extraout_RDX;
LAB_008f707c:
  local_58 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)this,(Vector *)(ulong)(uVar12 + 3),int_value)
  ;
  blob_00 = local_58._8_8_;
  if (local_58._0_4_ < 0xd) {
    blob_00 = local_58 + 4;
  }
  Varint::SetHeader(blob_00,(ulong)uVar12,false);
  if (0 < (int)uVar12) {
    lVar11 = (ulong)uVar12 - 1;
    uVar14 = (ulong)uVar12;
    lVar67 = uVar14 - 0xe;
    uVar10 = (ulong)uVar12;
    lVar75 = uVar10 - 0xf;
    lVar24 = uVar14 - 0xc;
    lVar25 = uVar10 - 0xd;
    lVar26 = uVar14 - 10;
    lVar27 = uVar10 - 0xb;
    lVar28 = uVar14 - 8;
    lVar29 = uVar10 - 9;
    lVar30 = uVar14 - 6;
    lVar31 = uVar10 - 7;
    lVar32 = uVar14 - 4;
    lVar33 = uVar10 - 5;
    lVar76 = uVar14 - 2;
    lVar77 = uVar10 - 3;
    lVar15 = uVar10 - 1;
    local_48._8_4_ = (int)lVar11;
    local_48._0_8_ = lVar11;
    local_48._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar10 = 0;
    do {
      auVar64._8_4_ = (int)uVar10;
      auVar64._0_8_ = uVar10;
      auVar64._12_4_ = (int)(uVar10 >> 0x20);
      auVar36 = local_48 ^ _DAT_01352200;
      auVar34 = (auVar64 | _DAT_0135a310) ^ _DAT_01352200;
      iVar65 = auVar36._0_4_;
      iVar40 = -(uint)(iVar65 < auVar34._0_4_);
      iVar66 = auVar36._4_4_;
      iVar52 = -(uint)(iVar66 < auVar34._4_4_);
      iVar38 = auVar36._8_4_;
      iVar53 = -(uint)(iVar38 < auVar34._8_4_);
      iVar39 = auVar36._12_4_;
      iVar54 = -(uint)(iVar39 < auVar34._12_4_);
      auVar68._4_4_ = iVar40;
      auVar68._0_4_ = iVar40;
      auVar68._8_4_ = iVar53;
      auVar68._12_4_ = iVar53;
      auVar60 = pshuflw(in_XMM12,auVar68,0xe8);
      auVar42._4_4_ = -(uint)(auVar34._4_4_ == iVar66);
      auVar42._12_4_ = -(uint)(auVar34._12_4_ == iVar39);
      auVar42._0_4_ = auVar42._4_4_;
      auVar42._8_4_ = auVar42._12_4_;
      auVar55 = pshuflw(in_XMM10,auVar42,0xe8);
      auVar35._4_4_ = iVar52;
      auVar35._0_4_ = iVar52;
      auVar35._8_4_ = iVar54;
      auVar35._12_4_ = iVar54;
      auVar34 = pshuflw(_DAT_01352200,auVar35,0xe8);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar34 | auVar55 & auVar60) ^ auVar36;
      auVar34 = packssdw(auVar36,auVar36);
      local_38 = lVar67;
      lStack_30 = lVar75;
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 3] = (char)((ulong)result >> (((char)uVar14 + -1) * '\b' & 0x3fU));
      }
      auVar35 = auVar42 & auVar68 | auVar35;
      auVar34 = packssdw(auVar35,auVar35);
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar55,auVar34 ^ auVar55);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 4] = (char)((ulong)result >> ((byte)((int)(lVar15 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0135a330) ^ _DAT_01352200;
      iVar40 = -(uint)(iVar65 < auVar34._0_4_);
      iVar53 = -(uint)(iVar66 < auVar34._4_4_);
      iVar52 = -(uint)(iVar38 < auVar34._8_4_);
      iVar54 = -(uint)(iVar39 < auVar34._12_4_);
      auVar41._4_4_ = iVar40;
      auVar41._0_4_ = iVar40;
      auVar41._8_4_ = iVar52;
      auVar41._12_4_ = iVar52;
      iVar40 = -(uint)(auVar34._4_4_ == iVar66);
      iVar52 = -(uint)(auVar34._12_4_ == iVar39);
      auVar69._4_4_ = iVar40;
      auVar69._0_4_ = iVar40;
      auVar69._8_4_ = iVar52;
      auVar69._12_4_ = iVar52;
      auVar61._4_4_ = iVar53;
      auVar61._0_4_ = iVar53;
      auVar61._8_4_ = iVar54;
      auVar61._12_4_ = iVar54;
      auVar34 = auVar69 & auVar41 | auVar61;
      auVar34 = packssdw(auVar34,auVar34);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar60,auVar34 ^ auVar60);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
        blob_00[uVar10 + 5] = (char)((ulong)result >> (((char)lVar76 + -1) * '\b' & 0x3fU));
      }
      auVar34 = pshufhw(auVar34,auVar41,0x84);
      auVar42 = pshufhw(auVar41,auVar69,0x84);
      auVar36 = pshufhw(auVar34,auVar61,0x84);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar16 = (auVar36 | auVar42 & auVar34) ^ auVar16;
      auVar34 = packssdw(auVar16,auVar16);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 0x18 & 1) != 0) {
        blob_00[uVar10 + 6] = (char)((ulong)result >> ((byte)((int)(lVar77 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0135a360) ^ _DAT_01352200;
      auVar56._0_4_ = -(uint)(iVar65 < auVar34._0_4_);
      auVar56._4_4_ = -(uint)(iVar66 < auVar34._4_4_);
      auVar56._8_4_ = -(uint)(iVar38 < auVar34._8_4_);
      auVar56._12_4_ = -(uint)(iVar39 < auVar34._12_4_);
      auVar70._4_4_ = auVar56._0_4_;
      auVar70._0_4_ = auVar56._0_4_;
      auVar70._8_4_ = auVar56._8_4_;
      auVar70._12_4_ = auVar56._8_4_;
      auVar42 = pshuflw(auVar61,auVar70,0xe8);
      auVar17._0_4_ = -(uint)(auVar34._0_4_ == iVar65);
      auVar17._4_4_ = -(uint)(auVar34._4_4_ == iVar66);
      auVar17._8_4_ = -(uint)(auVar34._8_4_ == iVar38);
      auVar17._12_4_ = -(uint)(auVar34._12_4_ == iVar39);
      auVar43._4_4_ = auVar17._4_4_;
      auVar43._0_4_ = auVar17._4_4_;
      auVar43._8_4_ = auVar17._12_4_;
      auVar43._12_4_ = auVar17._12_4_;
      auVar34 = pshuflw(auVar17,auVar43,0xe8);
      auVar44._4_4_ = auVar56._4_4_;
      auVar44._0_4_ = auVar56._4_4_;
      auVar44._8_4_ = auVar56._12_4_;
      auVar44._12_4_ = auVar56._12_4_;
      auVar36 = pshuflw(auVar56,auVar44,0xe8);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 & auVar42,(auVar36 | auVar34 & auVar42) ^ auVar1);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 7] = (char)((ulong)result >> (((char)lVar32 + -1) * '\b' & 0x3fU));
      }
      auVar44 = auVar43 & auVar70 | auVar44;
      auVar36 = packssdw(auVar44,auVar44);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34,auVar36 ^ auVar2);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._4_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 8] = (char)((ulong)result >> ((byte)((int)(lVar33 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0135a350) ^ _DAT_01352200;
      iVar40 = -(uint)(iVar65 < auVar34._0_4_);
      iVar53 = -(uint)(iVar66 < auVar34._4_4_);
      iVar52 = -(uint)(iVar38 < auVar34._8_4_);
      iVar54 = -(uint)(iVar39 < auVar34._12_4_);
      auVar45._4_4_ = iVar40;
      auVar45._0_4_ = iVar40;
      auVar45._8_4_ = iVar52;
      auVar45._12_4_ = iVar52;
      iVar40 = -(uint)(auVar34._4_4_ == iVar66);
      iVar52 = -(uint)(auVar34._12_4_ == iVar39);
      auVar62._4_4_ = iVar40;
      auVar62._0_4_ = iVar40;
      auVar62._8_4_ = iVar52;
      auVar62._12_4_ = iVar52;
      auVar71._4_4_ = iVar53;
      auVar71._0_4_ = iVar53;
      auVar71._8_4_ = iVar54;
      auVar71._12_4_ = iVar54;
      auVar34 = auVar62 & auVar45 | auVar71;
      auVar34 = packssdw(auVar34,auVar34);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar3,auVar34 ^ auVar3);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 9] = (char)((ulong)result >> (((char)lVar30 + -1) * '\b' & 0x3fU));
      }
      auVar34 = pshufhw(auVar34,auVar45,0x84);
      auVar42 = pshufhw(auVar45,auVar62,0x84);
      auVar36 = pshufhw(auVar34,auVar71,0x84);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar18 = (auVar36 | auVar42 & auVar34) ^ auVar18;
      auVar34 = packssdw(auVar18,auVar18);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._6_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 10] = (char)((ulong)result >> ((byte)((int)(lVar31 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0137a670) ^ _DAT_01352200;
      auVar57._0_4_ = -(uint)(iVar65 < auVar34._0_4_);
      auVar57._4_4_ = -(uint)(iVar66 < auVar34._4_4_);
      auVar57._8_4_ = -(uint)(iVar38 < auVar34._8_4_);
      auVar57._12_4_ = -(uint)(iVar39 < auVar34._12_4_);
      auVar72._4_4_ = auVar57._0_4_;
      auVar72._0_4_ = auVar57._0_4_;
      auVar72._8_4_ = auVar57._8_4_;
      auVar72._12_4_ = auVar57._8_4_;
      auVar42 = pshuflw(auVar62,auVar72,0xe8);
      auVar19._0_4_ = -(uint)(auVar34._0_4_ == iVar65);
      auVar19._4_4_ = -(uint)(auVar34._4_4_ == iVar66);
      auVar19._8_4_ = -(uint)(auVar34._8_4_ == iVar38);
      auVar19._12_4_ = -(uint)(auVar34._12_4_ == iVar39);
      auVar46._4_4_ = auVar19._4_4_;
      auVar46._0_4_ = auVar19._4_4_;
      auVar46._8_4_ = auVar19._12_4_;
      auVar46._12_4_ = auVar19._12_4_;
      auVar34 = pshuflw(auVar19,auVar46,0xe8);
      auVar47._4_4_ = auVar57._4_4_;
      auVar47._0_4_ = auVar57._4_4_;
      auVar47._8_4_ = auVar57._12_4_;
      auVar47._12_4_ = auVar57._12_4_;
      auVar36 = pshuflw(auVar57,auVar47,0xe8);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar58 = (auVar36 | auVar34 & auVar42) ^ auVar58;
      auVar36 = packssdw(auVar58,auVar58);
      auVar34 = packsswb(auVar34 & auVar42,auVar36);
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0xb] = (char)((ulong)result >> (((char)lVar28 + -1) * '\b' & 0x3fU));
      }
      auVar47 = auVar46 & auVar72 | auVar47;
      auVar36 = packssdw(auVar47,auVar47);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar4,auVar36 ^ auVar4);
      auVar34 = packsswb(auVar34,auVar36);
      if ((auVar34._8_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0xc] = (char)((ulong)result >> ((byte)((int)(lVar29 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0137a660) ^ _DAT_01352200;
      iVar40 = -(uint)(iVar65 < auVar34._0_4_);
      iVar53 = -(uint)(iVar66 < auVar34._4_4_);
      iVar52 = -(uint)(iVar38 < auVar34._8_4_);
      iVar54 = -(uint)(iVar39 < auVar34._12_4_);
      auVar48._4_4_ = iVar40;
      auVar48._0_4_ = iVar40;
      auVar48._8_4_ = iVar52;
      auVar48._12_4_ = iVar52;
      iVar40 = -(uint)(auVar34._4_4_ == iVar66);
      iVar52 = -(uint)(auVar34._12_4_ == iVar39);
      auVar63._4_4_ = iVar40;
      auVar63._0_4_ = iVar40;
      auVar63._8_4_ = iVar52;
      auVar63._12_4_ = iVar52;
      auVar73._4_4_ = iVar53;
      auVar73._0_4_ = iVar53;
      auVar73._8_4_ = iVar54;
      auVar73._12_4_ = iVar54;
      auVar34 = auVar63 & auVar48 | auVar73;
      auVar34 = packssdw(auVar34,auVar34);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0xd] = (char)((ulong)result >> (((char)lVar26 + -1) * '\b' & 0x3fU));
      }
      auVar34 = pshufhw(auVar34,auVar48,0x84);
      auVar42 = pshufhw(auVar48,auVar63,0x84);
      auVar36 = pshufhw(auVar34,auVar73,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar36 | auVar42 & auVar34) ^ auVar20;
      auVar34 = packssdw(auVar20,auVar20);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._10_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0xe] = (char)((ulong)result >> ((byte)((int)(lVar27 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0137a650) ^ _DAT_01352200;
      auVar59._0_4_ = -(uint)(iVar65 < auVar34._0_4_);
      auVar59._4_4_ = -(uint)(iVar66 < auVar34._4_4_);
      auVar59._8_4_ = -(uint)(iVar38 < auVar34._8_4_);
      auVar59._12_4_ = -(uint)(iVar39 < auVar34._12_4_);
      auVar74._4_4_ = auVar59._0_4_;
      auVar74._0_4_ = auVar59._0_4_;
      auVar74._8_4_ = auVar59._8_4_;
      auVar74._12_4_ = auVar59._8_4_;
      auVar42 = pshuflw(auVar63,auVar74,0xe8);
      auVar21._0_4_ = -(uint)(auVar34._0_4_ == iVar65);
      auVar21._4_4_ = -(uint)(auVar34._4_4_ == iVar66);
      auVar21._8_4_ = -(uint)(auVar34._8_4_ == iVar38);
      auVar21._12_4_ = -(uint)(auVar34._12_4_ == iVar39);
      auVar49._4_4_ = auVar21._4_4_;
      auVar49._0_4_ = auVar21._4_4_;
      auVar49._8_4_ = auVar21._12_4_;
      auVar49._12_4_ = auVar21._12_4_;
      auVar34 = pshuflw(auVar21,auVar49,0xe8);
      auVar50._4_4_ = auVar59._4_4_;
      auVar50._0_4_ = auVar59._4_4_;
      auVar50._8_4_ = auVar59._12_4_;
      auVar50._12_4_ = auVar59._12_4_;
      auVar36 = pshuflw(auVar59,auVar50,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 & auVar42,(auVar36 | auVar34 & auVar42) ^ auVar6);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0xf] = (char)((ulong)result >> (((char)lVar24 + -1) * '\b' & 0x3fU));
      }
      auVar50 = auVar49 & auVar74 | auVar50;
      auVar36 = packssdw(auVar50,auVar50);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34,auVar36 ^ auVar7);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._12_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0x10] = (char)((ulong)result >> ((byte)((int)(lVar25 + -1) << 3) & 0x3f));
      }
      lVar75 = lStack_30;
      lVar67 = local_38;
      lVar11 = lStack_30 + -1;
      auVar34 = (auVar64 | _DAT_0137a640) ^ _DAT_01352200;
      auVar22._0_4_ = -(uint)(iVar65 < auVar34._0_4_);
      auVar22._4_4_ = -(uint)(iVar66 < auVar34._4_4_);
      auVar22._8_4_ = -(uint)(iVar38 < auVar34._8_4_);
      auVar22._12_4_ = -(uint)(iVar39 < auVar34._12_4_);
      auVar51._4_4_ = auVar22._0_4_;
      auVar51._0_4_ = auVar22._0_4_;
      auVar51._8_4_ = auVar22._8_4_;
      auVar51._12_4_ = auVar22._8_4_;
      iVar65 = -(uint)(auVar34._4_4_ == iVar66);
      iVar66 = -(uint)(auVar34._12_4_ == iVar39);
      auVar37._4_4_ = iVar65;
      auVar37._0_4_ = iVar65;
      auVar37._8_4_ = iVar66;
      auVar37._12_4_ = iVar66;
      in_XMM12._4_4_ = auVar22._4_4_;
      in_XMM12._0_4_ = auVar22._4_4_;
      in_XMM12._8_4_ = auVar22._12_4_;
      in_XMM12._12_4_ = auVar22._12_4_;
      in_XMM10 = auVar37 & auVar51 | in_XMM12;
      auVar34 = packssdw(auVar22,in_XMM10);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar8,auVar34 ^ auVar8);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0x11] = (char)((ulong)result >> (((char)local_38 + -1) * '\b' & 0x3fU));
      }
      auVar34 = pshufhw(auVar34,auVar51,0x84);
      auVar42 = pshufhw(auVar37,auVar37,0x84);
      auVar36 = pshufhw(auVar34,in_XMM12,0x84);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar36 | auVar42 & auVar34) ^ auVar23;
      auVar34 = packssdw(auVar23,auVar23);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._14_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0x12] = (char)((ulong)result >> ((byte)((int)lVar11 << 3) & 0x3f));
      }
      uVar10 = uVar10 + 0x10;
      uVar14 = uVar14 - 0x10;
      lVar15 = lVar15 + -0x10;
      lVar76 = lVar76 + -0x10;
      lVar77 = lVar77 + -0x10;
      lVar32 = lVar32 + -0x10;
      lVar33 = lVar33 + -0x10;
      lVar30 = lVar30 + -0x10;
      lVar31 = lVar31 + -0x10;
      lVar28 = lVar28 + -0x10;
      lVar29 = lVar29 + -0x10;
      lVar26 = lVar26 + -0x10;
      lVar27 = lVar27 + -0x10;
      lVar24 = lVar24 + -0x10;
      lVar25 = lVar25 + -0x10;
      lVar67 = lVar67 + -0x10;
      lVar75 = lVar75 + -0x10;
    } while ((uVar12 + 0xf & 0xfffffff0) != uVar10);
  }
  uVar10 = (ulong)(uint)local_58._0_4_;
  if (uVar10 < 0xd) {
    switchD_005700f1::default(local_58 + 4 + uVar10,0,0xc - uVar10);
  }
  else {
    local_58._4_4_ = *(undefined4 *)local_58._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_58;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}